

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

uint64_t __thiscall
Imf_3_3::Compressor::runDecodeStep
          (Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  bool bVar1;
  exr_result_t eVar2;
  pointer pcVar3;
  undefined8 uVar4;
  unsigned_long *puVar5;
  ArgExc *this_00;
  char *text;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  uint64_t fullbuf;
  uint64_t expectedOutputSize;
  exr_chunk_info_t cinfo;
  exr_result_t rv;
  exr_decode_pipeline_t *in_stack_00000130;
  exr_chunk_info_t *in_stack_00000138;
  int in_stack_00000144;
  exr_const_context_t in_stack_00000148;
  char *in_stack_ffffffffffffff28;
  exr_decode_pipeline_t *in_stack_ffffffffffffff30;
  exr_chunk_info_t *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int part_index;
  exr_const_context_t in_stack_ffffffffffffff48;
  unsigned_long local_98 [3];
  ulong local_80;
  undefined1 local_78 [22];
  undefined1 local_62;
  exr_chunk_info_t *in_stack_ffffffffffffffa8;
  ulong in_stack_ffffffffffffffb0;
  exr_attr_box2i_t *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint64_t local_8;
  
  part_index = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (in_EDX == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<char[],_std::default_delete<char[]>_> *)0x1898af);
    if (!bVar1) {
      *(long *)(in_RDI + 0x440) = *(long *)(in_RDI + 0x20) * (long)*(int *)(in_RDI + 0x28);
      operator_new__(*(ulong *)(in_RDI + 0x440));
      std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        in_stack_ffffffffffffff30);
    *in_R8 = pcVar3;
    local_8 = 0;
  }
  else {
    memset(local_78,0,0x40);
    Context::operator_cast_to__priv_exr_context_t_((Context *)0x189942);
    local_80 = in_stack_ffffffffffffffb0;
    eVar2 = exr_chunk_default_initialize
                      ((exr_context_t)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                       (int)(in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                       in_stack_ffffffffffffffa8);
    if (eVar2 != 0) {
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    if ((*(int *)(in_RDI + 0x30) == 2) || (*(int *)(in_RDI + 0x30) == 3)) {
      if (*(long *)(in_RDI + 0x448) == 0) {
        local_80 = *(ulong *)(in_RDI + 0x20);
      }
      else {
        local_80 = *(ulong *)(in_RDI + 0x448);
      }
    }
    local_62 = (undefined1)*(undefined4 *)(in_RDI + 0x30);
    if (*(ulong *)(in_RDI + 0x440) < local_80) {
      local_98[0] = *(long *)(in_RDI + 0x20) * (long)*(int *)(in_RDI + 0x28);
      puVar5 = std::max<unsigned_long>(local_98,&local_80);
      *(unsigned_long *)(in_RDI + 0x440) = *puVar5;
      part_index = (int)((ulong)(in_RDI + 0x438) >> 0x20);
      operator_new__(*(ulong *)(in_RDI + 0x440));
      std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
    if ((*(byte *)(in_RDI + 0x430) & 1) == 0) {
      Context::operator_cast_to__priv_exr_context_t_((Context *)0x189ae1);
      eVar2 = exr_decoding_initialize
                        (in_stack_00000148,in_stack_00000144,in_stack_00000138,in_stack_00000130);
      if (eVar2 != 0) {
        uVar4 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      *(undefined1 *)(in_RDI + 0x430) = 1;
    }
    else {
      Context::operator_cast_to__priv_exr_context_t_((Context *)0x189b78);
      eVar2 = exr_decoding_update(in_stack_ffffffffffffff48,part_index,in_stack_ffffffffffffff38,
                                  in_stack_ffffffffffffff30);
      if (eVar2 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffff28);
        __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    *(undefined8 *)(in_RDI + 0xb0) = in_RSI;
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        in_stack_ffffffffffffff30);
    *(pointer *)(in_RDI + 0xc0) = pcVar3;
    *(undefined8 *)(in_RDI + 200) = *(undefined8 *)(in_RDI + 0x440);
    eVar2 = exr_uncompress_chunk((exr_decode_pipeline_t *)in_stack_ffffffffffffff48);
    *(undefined8 *)(in_RDI + 0xb0) = 0;
    *(undefined8 *)(in_RDI + 0xc0) = 0;
    *(undefined8 *)(in_RDI + 200) = 0;
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        in_stack_ffffffffffffff30);
    *in_R8 = pcVar3;
    if (eVar2 != 0) {
      text = (char *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff30,text);
      __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    local_8 = *(uint64_t *)(in_RDI + 0xa0);
  }
  return local_8;
}

Assistant:

uint64_t
Compressor::runDecodeStep (
    const char* inPtr,
    int inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*& outPtr)
{
    // special case
    if (inSize == 0)
    {
        if (!_memory_buffer)
        {
            _buf_sz = _maxScanLineSize * _numScanLines;
            _memory_buffer.reset (new char[_buf_sz]);
        }
        outPtr = _memory_buffer.get ();
        return 0;
    }

    exr_result_t rv;
    exr_chunk_info_t cinfo = {0};
    uint64_t expectedOutputSize;

    if (EXR_ERR_SUCCESS != exr_chunk_default_initialize (
            _ctxt, 0, (const exr_attr_box2i_t*) &range, _levelX, _levelY, &cinfo))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize chunk information");

    if (_store_type == EXR_STORAGE_DEEP_SCANLINE ||
        _store_type == EXR_STORAGE_DEEP_TILED)
    {
        if (_expectedSize != 0)
        {
            expectedOutputSize = _expectedSize;
            cinfo.unpacked_size = _expectedSize;
        }
        else
        {
            expectedOutputSize = _maxScanLineSize;
            cinfo.unpacked_size = _maxScanLineSize;
        }
    }
    else
    {
        expectedOutputSize = cinfo.unpacked_size;
    }

    cinfo.packed_size = inSize;
    cinfo.type = _store_type;
    if (_buf_sz < expectedOutputSize)
    {
        uint64_t fullbuf = _maxScanLineSize * _numScanLines;
        _buf_sz = std::max (fullbuf, expectedOutputSize);
        _memory_buffer.reset (new char[_buf_sz]);
    }

    if (!_decoder_init)
    {
        if (EXR_ERR_SUCCESS != exr_decoding_initialize(_ctxt, 0, &cinfo, &_decoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize decoder type");

        _decoder_init = true;
    }
    else
    {
        if (EXR_ERR_SUCCESS != exr_decoding_update(_ctxt, 0, &cinfo, &_decoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to update decoder");
    }

//    if (_store_type == EXR_STORAGE_DEEP_SCANLINE ||
//        _store_type == EXR_STORAGE_DEEP_TILED)
//    {
//        _decoder.decode_flags |= EXR_DECODE_ALLOW_SHORT_DECODE;
//    }

    _decoder.packed_buffer = const_cast<char*> (inPtr);
    _decoder.unpacked_buffer = _memory_buffer.get();
    _decoder.unpacked_alloc_size = _buf_sz;

    rv = exr_uncompress_chunk(&_decoder);

    _decoder.packed_buffer   = nullptr;
    _decoder.unpacked_buffer = nullptr;
    _decoder.unpacked_alloc_size = 0;

    outPtr = _memory_buffer.get ();

    if (EXR_ERR_SUCCESS != rv)
        throw IEX_NAMESPACE::ArgExc ("Unable to run compression routine");

    return _decoder.bytes_decompressed;
}